

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O0

LY_ERR lys_compile_unres_when_cyclic(lyxp_set *set,lysc_node *node)

{
  lysc_when *plVar1;
  ly_bool lVar2;
  lysc_when **pplVar3;
  bool bVar4;
  lysc_when *local_f0;
  lysc_when *when;
  lysc_when **when_list;
  lysc_when *plStack_c8;
  LY_ERR ret;
  uint64_t u;
  uint local_b8;
  uint32_t idx;
  uint32_t j;
  uint32_t i;
  lyxp_set_scnode *xp_scnode;
  lyxp_set tmp_set;
  lysc_node *node_local;
  lyxp_set *set_local;
  
  when_list._4_4_ = LY_SUCCESS;
  tmp_set._136_8_ = node;
  memset(&xp_scnode,0,0x90);
  for (idx = 0; idx < set->used; idx = idx + 1) {
    _j = (undefined8 *)((long)(set->val).nodes + (ulong)idx * 0x18);
    if (*(int *)((long)_j + 0xc) != -1) {
      *(undefined4 *)((long)_j + 0xc) = 2;
    }
  }
  idx = 0;
  do {
    if (set->used <= idx) {
LAB_00167b8e:
      lyxp_set_free_content((lyxp_set *)&xp_scnode);
      return when_list._4_4_;
    }
    _j = (undefined8 *)((long)(set->val).nodes + (ulong)idx * 0x18);
    if (*(int *)((long)_j + 0xc) == 2) {
      if ((*(int *)(_j + 1) == 3) &&
         (pplVar3 = lysc_node_when((lysc_node *)*_j), pplVar3 != (lysc_when **)0x0)) {
        tmp_set._136_8_ = *_j;
        do {
          ly_log_location((lysc_node *)tmp_set._136_8_,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
          pplVar3 = lysc_node_when((lysc_node *)tmp_set._136_8_);
          plStack_c8 = (lysc_when *)0x0;
          while( true ) {
            if (pplVar3 == (lysc_when **)0x0) {
              local_f0 = (lysc_when *)0x0;
            }
            else {
              local_f0 = pplVar3[-1];
            }
            if (local_f0 <= plStack_c8) break;
            plVar1 = pplVar3[(long)plStack_c8];
            when_list._4_4_ =
                 lyxp_atomize(set->ctx,plVar1->cond,*(lys_module **)(tmp_set._136_8_ + 8),
                              LY_VALUE_SCHEMA_RESOLVED,plVar1->prefixes,plVar1->context,
                              plVar1->context,(lyxp_set *)&xp_scnode,8);
            if (when_list._4_4_ != LY_SUCCESS) {
              ly_vlog(set->ctx,(char *)0x0,LYVE_SEMANTICS,"Invalid when condition \"%s\".",
                      plVar1->cond->expr);
              ly_log_location_revert(1,0,0,0);
              goto LAB_00167b8e;
            }
            for (local_b8 = 0; local_b8 < (uint)tmp_set.val._8_4_; local_b8 = local_b8 + 1) {
              if (*(int *)(tmp_set._8_8_ + (ulong)local_b8 * 0x18 + 8) == 3) {
                lVar2 = lyxp_set_scnode_contains
                                  (set,*(lysc_node **)(tmp_set._8_8_ + (ulong)local_b8 * 0x18),
                                   LYXP_NODE_ELEM,-1,(uint32_t *)((long)&u + 4));
                if ((lVar2 != '\0') &&
                   (*(int *)((long)(set->val).nodes + (ulong)u._4_4_ * 0x18 + 0xc) == -1)) {
                  ly_vlog(set->ctx,(char *)0x0,LYVE_SEMANTICS,
                          "When condition cyclic dependency on the node \"%s\".",
                          *(undefined8 *)(*(long *)(tmp_set._8_8_ + (ulong)local_b8 * 0x18) + 0x28))
                  ;
                  when_list._4_4_ = LY_EVALID;
                  ly_log_location_revert(1,0,0,0);
                  goto LAB_00167b8e;
                }
                *(undefined4 *)(tmp_set._8_8_ + (ulong)local_b8 * 0x18 + 0xc) = 2;
              }
              else {
                *(undefined4 *)(tmp_set._8_8_ + (ulong)local_b8 * 0x18 + 0xc) = 0;
              }
            }
            if (plVar1->context != (lysc_node *)tmp_set._136_8_) {
              if (*(lysc_node **)tmp_set._8_8_ != plVar1->context) {
                __assert_fail("tmp_set.val.scnodes[0].scnode == when->context",
                              "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
                              ,0x236,
                              "LY_ERR lys_compile_unres_when_cyclic(struct lyxp_set *, const struct lysc_node *)"
                             );
              }
              if (*(int *)(tmp_set._8_8_ + 0xc) == -1) {
                *(undefined8 *)tmp_set._8_8_ = tmp_set._136_8_;
              }
              else {
                when_list._4_4_ =
                     lyxp_set_scnode_insert_node
                               ((lyxp_set *)&xp_scnode,(lysc_node *)tmp_set._136_8_,~LYXP_NODE_NONE,
                                LYXP_AXIS_CHILD,(uint32_t *)0x0);
                if (when_list._4_4_ != LY_SUCCESS) {
                  ly_log_location_revert(1,0,0,0);
                  goto LAB_00167b8e;
                }
              }
            }
            lyxp_set_scnode_merge(set,(lyxp_set *)&xp_scnode);
            plStack_c8 = (lysc_when *)((long)&plStack_c8->cond + 1);
          }
          ly_log_location_revert(1,0,0,0);
          tmp_set._136_8_ = *(undefined8 *)(tmp_set._136_8_ + 0x10);
          bVar4 = false;
          if ((ushort *)tmp_set._136_8_ != (ushort *)0x0) {
            bVar4 = (*(ushort *)tmp_set._136_8_ & 0x82) != 0;
          }
        } while (bVar4);
        *(undefined4 *)((long)(set->val).nodes + (ulong)idx * 0x18 + 0xc) = 0;
      }
      else {
        *(undefined4 *)((long)_j + 0xc) = 0;
      }
    }
    idx = idx + 1;
  } while( true );
}

Assistant:

static LY_ERR
lys_compile_unres_when_cyclic(struct lyxp_set *set, const struct lysc_node *node)
{
    struct lyxp_set tmp_set;
    struct lyxp_set_scnode *xp_scnode;
    uint32_t i, j, idx;
    LY_ARRAY_COUNT_TYPE u;
    LY_ERR ret = LY_SUCCESS;

    memset(&tmp_set, 0, sizeof tmp_set);

    /* prepare in_ctx of the set */
    for (i = 0; i < set->used; ++i) {
        xp_scnode = &set->val.scnodes[i];

        if (xp_scnode->in_ctx != LYXP_SET_SCNODE_START_USED) {
            /* check node when, skip the context node (it was just checked) */
            xp_scnode->in_ctx = LYXP_SET_SCNODE_ATOM_CTX;
        }
    }

    for (i = 0; i < set->used; ++i) {
        xp_scnode = &set->val.scnodes[i];
        if (xp_scnode->in_ctx != LYXP_SET_SCNODE_ATOM_CTX) {
            /* already checked */
            continue;
        }

        if ((xp_scnode->type != LYXP_NODE_ELEM) || !lysc_node_when(xp_scnode->scnode)) {
            /* no when to check */
            xp_scnode->in_ctx = LYXP_SET_SCNODE_ATOM_NODE;
            continue;
        }

        node = xp_scnode->scnode;
        do {
            struct lysc_when **when_list, *when;

            LOG_LOCSET(node, NULL);
            when_list = lysc_node_when(node);
            LY_ARRAY_FOR(when_list, u) {
                when = when_list[u];
                ret = lyxp_atomize(set->ctx, when->cond, node->module, LY_VALUE_SCHEMA_RESOLVED, when->prefixes,
                        when->context, when->context, &tmp_set, LYXP_SCNODE_SCHEMA);
                if (ret != LY_SUCCESS) {
                    LOGVAL(set->ctx, LYVE_SEMANTICS, "Invalid when condition \"%s\".", when->cond->expr);
                    LOG_LOCBACK(1, 0);
                    goto cleanup;
                }

                for (j = 0; j < tmp_set.used; ++j) {
                    if (tmp_set.val.scnodes[j].type != LYXP_NODE_ELEM) {
                        /* skip roots'n'stuff, no when, nothing to check */
                        tmp_set.val.scnodes[j].in_ctx = LYXP_SET_SCNODE_ATOM_NODE;
                        continue;
                    }

                    /* try to find this node in our set */
                    if (lyxp_set_scnode_contains(set, tmp_set.val.scnodes[j].scnode, LYXP_NODE_ELEM, -1, &idx) &&
                            (set->val.scnodes[idx].in_ctx == LYXP_SET_SCNODE_START_USED)) {
                        LOGVAL(set->ctx, LYVE_SEMANTICS, "When condition cyclic dependency on the node \"%s\".",
                                tmp_set.val.scnodes[j].scnode->name);
                        ret = LY_EVALID;
                        LOG_LOCBACK(1, 0);
                        goto cleanup;
                    }

                    /* needs to be checked, if in both sets, will be ignored */
                    tmp_set.val.scnodes[j].in_ctx = LYXP_SET_SCNODE_ATOM_CTX;
                }

                if (when->context != node) {
                    /* node actually depends on this "when", not the context node */
                    assert(tmp_set.val.scnodes[0].scnode == when->context);
                    if (tmp_set.val.scnodes[0].in_ctx == LYXP_SET_SCNODE_START_USED) {
                        /* replace the non-traversed context node with the dependent node */
                        tmp_set.val.scnodes[0].scnode = (struct lysc_node *)node;
                    } else {
                        /* context node was traversed, so just add the dependent node */
                        ret = lyxp_set_scnode_insert_node(&tmp_set, node, LYXP_SET_SCNODE_START_USED, LYXP_AXIS_CHILD, NULL);
                        LY_CHECK_ERR_GOTO(ret, LOG_LOCBACK(1, 0), cleanup);
                    }
                }

                /* merge this set into the global when set */
                lyxp_set_scnode_merge(set, &tmp_set);
            }
            LOG_LOCBACK(1, 0);

            /* check when of non-data parents as well */
            node = node->parent;
        } while (node && (node->nodetype & (LYS_CASE | LYS_CHOICE)));

        /* this node when was checked (xp_scnode could have been reallocd) */
        set->val.scnodes[i].in_ctx = LYXP_SET_SCNODE_ATOM_NODE;
    }

cleanup:
    lyxp_set_free_content(&tmp_set);
    return ret;
}